

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

void __thiscall spvtools::opt::FoldingRules::AddFoldingRules(FoldingRules *this)

{
  mapped_type *pmVar1;
  mapped_type *this_00;
  value_type local_c00;
  key_type local_bdc;
  uint32_t local_bd4;
  FeatureManager *pFStack_bd0;
  uint32_t ext_inst_glslstd450_id;
  FeatureManager *feature_manager;
  key_type local_ba4;
  value_type local_ba0;
  key_type local_b7c;
  value_type local_b78;
  key_type local_b54;
  value_type local_b50;
  key_type local_b2c;
  value_type local_b28;
  key_type local_b04;
  value_type local_b00;
  key_type local_adc;
  value_type local_ad8;
  key_type local_ab4;
  value_type local_ab0;
  key_type local_a8c;
  value_type local_a88;
  key_type local_a64;
  value_type local_a60;
  key_type local_a3c;
  value_type local_a38;
  key_type local_a14;
  value_type local_a10;
  key_type local_9ec;
  value_type local_9e8;
  key_type local_9c4;
  value_type local_9c0;
  key_type local_99c;
  value_type local_998;
  key_type local_974;
  value_type local_970;
  key_type local_94c;
  value_type local_948;
  key_type local_924;
  value_type local_920;
  key_type local_8fc;
  value_type local_8f8;
  key_type local_8d4;
  value_type local_8d0;
  key_type local_8ac;
  value_type local_8a8;
  key_type local_884;
  value_type local_880;
  key_type local_85c;
  value_type local_858;
  key_type local_834;
  value_type local_830;
  key_type local_80c;
  value_type local_808;
  key_type local_7e4;
  value_type local_7e0;
  key_type local_7bc;
  value_type local_7b8;
  key_type local_794;
  value_type local_790;
  key_type local_76c;
  value_type local_768;
  key_type local_744;
  value_type local_740;
  key_type local_71c;
  value_type local_718;
  key_type local_6f4;
  value_type local_6f0;
  key_type local_6cc;
  value_type local_6c8;
  key_type local_6a4;
  value_type local_6a0;
  key_type local_67c;
  value_type local_678;
  key_type local_654;
  value_type local_650;
  key_type local_62c;
  value_type local_628;
  key_type local_604;
  value_type local_600;
  key_type local_5dc;
  value_type local_5d8;
  key_type local_5b4;
  value_type local_5b0;
  key_type local_58c;
  value_type local_588;
  key_type local_564;
  value_type local_560;
  key_type local_53c;
  value_type local_538;
  key_type local_514;
  value_type local_510;
  key_type local_4ec;
  value_type local_4e8;
  key_type local_4c4;
  value_type local_4c0;
  key_type local_49c;
  value_type local_498;
  key_type local_474;
  value_type local_470;
  key_type local_44c;
  value_type local_448;
  key_type local_424;
  value_type local_420;
  key_type local_3fc;
  value_type local_3f8;
  key_type local_3d4;
  value_type local_3d0;
  key_type local_3ac;
  value_type local_3a8;
  key_type local_384;
  value_type local_380;
  key_type local_35c;
  value_type local_358;
  key_type local_334;
  value_type local_330;
  key_type local_30c;
  value_type local_308;
  key_type local_2e4;
  value_type local_2e0;
  key_type local_2bc;
  value_type local_2b8;
  key_type local_294;
  value_type local_290;
  key_type local_26c;
  value_type local_268;
  key_type local_244;
  value_type local_240;
  key_type local_21c;
  value_type local_218;
  key_type local_1f4;
  value_type local_1f0;
  key_type local_1cc;
  value_type local_1c8;
  key_type local_1a4;
  value_type local_1a0;
  key_type local_17c;
  value_type local_178;
  key_type local_154;
  value_type local_150;
  key_type local_12c;
  value_type local_128;
  key_type local_104;
  value_type local_100;
  key_type local_dc;
  value_type local_d8;
  key_type local_b4;
  value_type local_b0;
  key_type local_8c;
  value_type local_88;
  key_type local_64;
  value_type local_60;
  key_type local_3c;
  value_type local_38;
  key_type local_14;
  FoldingRules *local_10;
  FoldingRules *this_local;
  
  local_14 = OpBitcast;
  local_10 = this;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_14);
  anon_unknown_0::BitCastScalarOrVector();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_38);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_38);
  local_3c = OpCompositeConstruct;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_3c);
  std::
  function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
  ::
  function<bool(&)(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&),void>
            ((function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
              *)&local_60,anon_unknown_0::CompositeExtractFeedingConstruct);
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_60);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_60);
  local_64 = OpCompositeExtract;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_64);
  anon_unknown_0::InsertFeedingExtract();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_88);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_88);
  local_8c = OpCompositeExtract;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_8c);
  std::
  function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
  ::
  function<bool(&)(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&),void>
            ((function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
              *)&local_b0,anon_unknown_0::CompositeConstructFeedingExtract);
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_b0);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_b0);
  local_b4 = OpCompositeExtract;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_b4);
  anon_unknown_0::VectorShuffleFeedingExtract();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_d8);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_d8);
  local_dc = OpCompositeExtract;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_dc);
  anon_unknown_0::FMixFeedingExtract();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_100);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_100);
  local_104 = OpCompositeInsert;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_104);
  std::
  function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
  ::
  function<bool(&)(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&),void>
            ((function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
              *)&local_128,anon_unknown_0::CompositeInsertToCompositeConstruct);
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_128);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_128);
  local_12c = OpDot;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_12c);
  anon_unknown_0::DotProductDoingExtract();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_150);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_150);
  local_154 = OpEntryPoint;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_154);
  anon_unknown_0::RemoveRedundantOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_178);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_178);
  local_17c = OpFAdd;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_17c);
  anon_unknown_0::RedundantFAdd();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_1a0);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_1a0);
  local_1a4 = OpFAdd;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_1a4);
  anon_unknown_0::MergeAddNegateArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_1c8);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_1c8);
  local_1cc = OpFAdd;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_1cc);
  anon_unknown_0::MergeAddAddArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_1f0);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_1f0);
  local_1f4 = OpFAdd;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_1f4);
  anon_unknown_0::MergeAddSubArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_218);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_218);
  local_21c = OpFAdd;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_21c);
  anon_unknown_0::MergeGenericAddSubArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_240);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_240);
  local_244 = OpFAdd;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_244);
  anon_unknown_0::FactorAddMuls();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_268);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_268);
  local_26c = OpFDiv;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_26c);
  anon_unknown_0::RedundantFDiv();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_290);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_290);
  local_294 = OpFDiv;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_294);
  anon_unknown_0::ReciprocalFDiv();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_2b8);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_2b8);
  local_2bc = OpFDiv;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_2bc);
  anon_unknown_0::MergeDivDivArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_2e0);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_2e0);
  local_2e4 = OpFDiv;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_2e4);
  anon_unknown_0::MergeDivMulArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_308);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_308);
  local_30c = OpFDiv;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_30c);
  anon_unknown_0::MergeDivNegateArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_330);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_330);
  local_334 = OpFMul;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_334);
  anon_unknown_0::RedundantFMul();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_358);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_358);
  local_35c = OpFMul;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_35c);
  anon_unknown_0::MergeMulMulArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_380);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_380);
  local_384 = OpFMul;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_384);
  anon_unknown_0::MergeMulDivArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_3a8);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_3a8);
  local_3ac = OpFMul;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_3ac);
  anon_unknown_0::MergeMulNegateArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_3d0);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_3d0);
  local_3d4 = OpFNegate;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_3d4);
  anon_unknown_0::MergeNegateArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_3f8);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_3f8);
  local_3fc = OpFNegate;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_3fc);
  anon_unknown_0::MergeNegateAddSubArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_420);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_420);
  local_424 = OpFNegate;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_424);
  anon_unknown_0::MergeNegateMulDivArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_448);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_448);
  local_44c = OpFSub;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_44c);
  anon_unknown_0::RedundantFSub();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_470);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_470);
  local_474 = OpFSub;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_474);
  anon_unknown_0::MergeSubNegateArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_498);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_498);
  local_49c = OpFSub;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_49c);
  anon_unknown_0::MergeSubAddArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_4c0);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_4c0);
  local_4c4 = OpFSub;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_4c4);
  anon_unknown_0::MergeSubSubArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_4e8);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_4e8);
  local_4ec = OpIAdd;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_4ec);
  anon_unknown_0::RedundantIAdd();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_510);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_510);
  local_514 = OpIAdd;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_514);
  anon_unknown_0::MergeAddNegateArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_538);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_538);
  local_53c = OpIAdd;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_53c);
  anon_unknown_0::MergeAddAddArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_560);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_560);
  local_564 = OpIAdd;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_564);
  anon_unknown_0::MergeAddSubArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_588);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_588);
  local_58c = OpIAdd;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_58c);
  anon_unknown_0::MergeGenericAddSubArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_5b0);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_5b0);
  local_5b4 = OpIAdd;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_5b4);
  anon_unknown_0::FactorAddMuls();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_5d8);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_5d8);
  local_5dc = OpIMul;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_5dc);
  anon_unknown_0::IntMultipleBy1();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_600);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_600);
  local_604 = OpIMul;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_604);
  anon_unknown_0::MergeMulMulArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_628);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_628);
  local_62c = OpIMul;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_62c);
  anon_unknown_0::MergeMulNegateArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_650);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_650);
  local_654 = OpISub;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_654);
  anon_unknown_0::MergeSubNegateArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_678);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_678);
  local_67c = OpISub;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_67c);
  anon_unknown_0::MergeSubAddArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_6a0);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_6a0);
  local_6a4 = OpISub;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_6a4);
  anon_unknown_0::MergeSubSubArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_6c8);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_6c8);
  local_6cc = OpPhi;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_6cc);
  anon_unknown_0::RedundantPhi();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_6f0);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_6f0);
  local_6f4 = OpSNegate;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_6f4);
  anon_unknown_0::MergeNegateArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_718);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_718);
  local_71c = OpSNegate;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_71c);
  anon_unknown_0::MergeNegateMulDivArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_740);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_740);
  local_744 = OpSNegate;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_744);
  anon_unknown_0::MergeNegateAddSubArithmetic();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_768);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_768);
  local_76c = OpSelect;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_76c);
  anon_unknown_0::RedundantSelect();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_790);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_790);
  local_794 = OpStore;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_794);
  anon_unknown_0::StoringUndef();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_7b8);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_7b8);
  local_7bc = OpVectorShuffle;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_7bc);
  anon_unknown_0::VectorShuffleFeedingShuffle();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_7e0);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_7e0);
  local_7e4 = OpImageSampleImplicitLod;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_7e4);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_808);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_808);
  local_80c = OpImageSampleExplicitLod;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_80c);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_830);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_830);
  local_834 = OpImageSampleDrefImplicitLod;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_834);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_858);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_858);
  local_85c = OpImageSampleDrefExplicitLod;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_85c);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_880);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_880);
  local_884 = OpImageSampleProjImplicitLod;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_884);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_8a8);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_8a8);
  local_8ac = OpImageSampleProjExplicitLod;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_8ac);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_8d0);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_8d0);
  local_8d4 = OpImageSampleProjDrefImplicitLod;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_8d4);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_8f8);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_8f8);
  local_8fc = OpImageSampleProjDrefExplicitLod;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_8fc);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_920);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_920);
  local_924 = OpImageFetch;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_924);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_948);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_948);
  local_94c = OpImageGather;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_94c);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_970);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_970);
  local_974 = OpImageDrefGather;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_974);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_998);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_998);
  local_99c = OpImageRead;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_99c);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_9c0);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_9c0);
  local_9c4 = OpImageWrite;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_9c4);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_9e8);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_9e8);
  local_9ec = OpImageSparseSampleImplicitLod;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_9ec);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_a10);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_a10);
  local_a14 = OpImageSparseSampleExplicitLod;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_a14);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_a38);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_a38);
  local_a3c = OpImageSparseSampleDrefImplicitLod;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_a3c);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_a60);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_a60);
  local_a64 = OpImageSparseSampleDrefExplicitLod;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_a64);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_a88);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_a88);
  local_a8c = OpImageSparseSampleProjImplicitLod;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_a8c);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_ab0);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_ab0);
  local_ab4 = OpImageSparseSampleProjExplicitLod;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_ab4);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_ad8);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_ad8);
  local_adc = OpImageSparseSampleProjDrefImplicitLod;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_adc);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_b00);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_b00);
  local_b04 = OpImageSparseSampleProjDrefExplicitLod;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_b04);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_b28);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_b28);
  local_b2c = OpImageSparseFetch;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_b2c);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_b50);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_b50);
  local_b54 = OpImageSparseGather;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_b54);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_b78);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_b78);
  local_b7c = OpImageSparseDrefGather;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_b7c);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,&local_ba0);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_ba0);
  local_ba4 = OpImageSparseRead;
  pmVar1 = std::
           unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
           ::operator[](&this->rules_,&local_ba4);
  anon_unknown_0::UpdateImageOperands();
  std::
  vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pmVar1,(value_type *)&feature_manager);
  std::
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function((function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
               *)&feature_manager);
  pFStack_bd0 = IRContext::get_feature_mgr(this->context_);
  local_bdc.instruction_set = FeatureManager::GetExtInstImportId_GLSLstd450(pFStack_bd0);
  if (local_bdc.instruction_set != 0) {
    local_bdc.opcode = 0x2e;
    local_bd4 = local_bdc.instruction_set;
    this_00 = std::
              map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
              ::operator[](&this->ext_rules_,&local_bdc);
    anon_unknown_0::RedundantFMix();
    std::
    vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(this_00,&local_c00);
    std::
    function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_c00);
  }
  return;
}

Assistant:

void FoldingRules::AddFoldingRules() {
  // Add all folding rules to the list for the opcodes to which they apply.
  // Note that the order in which rules are added to the list matters. If a rule
  // applies to the instruction, the rest of the rules will not be attempted.
  // Take that into consideration.
  rules_[spv::Op::OpBitcast].push_back(BitCastScalarOrVector());

  rules_[spv::Op::OpCompositeConstruct].push_back(
      CompositeExtractFeedingConstruct);

  rules_[spv::Op::OpCompositeExtract].push_back(InsertFeedingExtract());
  rules_[spv::Op::OpCompositeExtract].push_back(
      CompositeConstructFeedingExtract);
  rules_[spv::Op::OpCompositeExtract].push_back(VectorShuffleFeedingExtract());
  rules_[spv::Op::OpCompositeExtract].push_back(FMixFeedingExtract());

  rules_[spv::Op::OpCompositeInsert].push_back(
      CompositeInsertToCompositeConstruct);

  rules_[spv::Op::OpDot].push_back(DotProductDoingExtract());

  rules_[spv::Op::OpEntryPoint].push_back(RemoveRedundantOperands());

  rules_[spv::Op::OpFAdd].push_back(RedundantFAdd());
  rules_[spv::Op::OpFAdd].push_back(MergeAddNegateArithmetic());
  rules_[spv::Op::OpFAdd].push_back(MergeAddAddArithmetic());
  rules_[spv::Op::OpFAdd].push_back(MergeAddSubArithmetic());
  rules_[spv::Op::OpFAdd].push_back(MergeGenericAddSubArithmetic());
  rules_[spv::Op::OpFAdd].push_back(FactorAddMuls());

  rules_[spv::Op::OpFDiv].push_back(RedundantFDiv());
  rules_[spv::Op::OpFDiv].push_back(ReciprocalFDiv());
  rules_[spv::Op::OpFDiv].push_back(MergeDivDivArithmetic());
  rules_[spv::Op::OpFDiv].push_back(MergeDivMulArithmetic());
  rules_[spv::Op::OpFDiv].push_back(MergeDivNegateArithmetic());

  rules_[spv::Op::OpFMul].push_back(RedundantFMul());
  rules_[spv::Op::OpFMul].push_back(MergeMulMulArithmetic());
  rules_[spv::Op::OpFMul].push_back(MergeMulDivArithmetic());
  rules_[spv::Op::OpFMul].push_back(MergeMulNegateArithmetic());

  rules_[spv::Op::OpFNegate].push_back(MergeNegateArithmetic());
  rules_[spv::Op::OpFNegate].push_back(MergeNegateAddSubArithmetic());
  rules_[spv::Op::OpFNegate].push_back(MergeNegateMulDivArithmetic());

  rules_[spv::Op::OpFSub].push_back(RedundantFSub());
  rules_[spv::Op::OpFSub].push_back(MergeSubNegateArithmetic());
  rules_[spv::Op::OpFSub].push_back(MergeSubAddArithmetic());
  rules_[spv::Op::OpFSub].push_back(MergeSubSubArithmetic());

  rules_[spv::Op::OpIAdd].push_back(RedundantIAdd());
  rules_[spv::Op::OpIAdd].push_back(MergeAddNegateArithmetic());
  rules_[spv::Op::OpIAdd].push_back(MergeAddAddArithmetic());
  rules_[spv::Op::OpIAdd].push_back(MergeAddSubArithmetic());
  rules_[spv::Op::OpIAdd].push_back(MergeGenericAddSubArithmetic());
  rules_[spv::Op::OpIAdd].push_back(FactorAddMuls());

  rules_[spv::Op::OpIMul].push_back(IntMultipleBy1());
  rules_[spv::Op::OpIMul].push_back(MergeMulMulArithmetic());
  rules_[spv::Op::OpIMul].push_back(MergeMulNegateArithmetic());

  rules_[spv::Op::OpISub].push_back(MergeSubNegateArithmetic());
  rules_[spv::Op::OpISub].push_back(MergeSubAddArithmetic());
  rules_[spv::Op::OpISub].push_back(MergeSubSubArithmetic());

  rules_[spv::Op::OpPhi].push_back(RedundantPhi());

  rules_[spv::Op::OpSNegate].push_back(MergeNegateArithmetic());
  rules_[spv::Op::OpSNegate].push_back(MergeNegateMulDivArithmetic());
  rules_[spv::Op::OpSNegate].push_back(MergeNegateAddSubArithmetic());

  rules_[spv::Op::OpSelect].push_back(RedundantSelect());

  rules_[spv::Op::OpStore].push_back(StoringUndef());

  rules_[spv::Op::OpVectorShuffle].push_back(VectorShuffleFeedingShuffle());

  rules_[spv::Op::OpImageSampleImplicitLod].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageSampleExplicitLod].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageSampleDrefImplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSampleDrefExplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSampleProjImplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSampleProjExplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSampleProjDrefImplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSampleProjDrefExplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageFetch].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageGather].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageDrefGather].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageRead].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageWrite].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageSparseSampleImplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSparseSampleExplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSparseSampleDrefImplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSparseSampleDrefExplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSparseSampleProjImplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSparseSampleProjExplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSparseSampleProjDrefImplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSparseSampleProjDrefExplicitLod].push_back(
      UpdateImageOperands());
  rules_[spv::Op::OpImageSparseFetch].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageSparseGather].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageSparseDrefGather].push_back(UpdateImageOperands());
  rules_[spv::Op::OpImageSparseRead].push_back(UpdateImageOperands());

  FeatureManager* feature_manager = context_->get_feature_mgr();
  // Add rules for GLSLstd450
  uint32_t ext_inst_glslstd450_id =
      feature_manager->GetExtInstImportId_GLSLstd450();
  if (ext_inst_glslstd450_id != 0) {
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450FMix}].push_back(
        RedundantFMix());
  }
}